

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall mario::EventLoop::wakeup(EventLoop *this)

{
  Writer *pWVar1;
  Writer local_98;
  ssize_t local_20;
  ssize_t n;
  uint64_t one;
  EventLoop *this_local;
  
  n = 1;
  one = (uint64_t)this;
  local_20 = write(this->_wakeupFd,&n,8);
  if (local_20 != 8) {
    el::base::Writer::Writer
              (&local_98,Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EventLoop.cpp"
               ,0x89,"void mario::EventLoop::wakeup()",NormalLog,0);
    pWVar1 = el::base::Writer::construct(&local_98,1,el::base::consts::kDefaultLoggerId);
    pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [28])"EventLoop::wakeup() writes ");
    pWVar1 = el::base::Writer::operator<<(pWVar1,&local_20);
    el::base::Writer::operator<<(pWVar1,(char (*) [20])" bytes instead of 8");
    el::base::Writer::~Writer(&local_98);
  }
  return;
}

Assistant:

void EventLoop::wakeup() {
    uint64_t one = 1;
    ssize_t n = ::write(_wakeupFd, &one, sizeof(one));
    if (n != sizeof(one)) {
        LOG(FATAL) << "EventLoop::wakeup() writes " << n << " bytes instead of 8";
    }
}